

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O1

int __thiscall gl4cts::GPUShaderFP64Tests::init(GPUShaderFP64Tests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  int extraout_EAX;
  TestNode *pTVar2;
  GPUShaderFP64Test4 *this_00;
  GPUShaderFP64Test5 *this_01;
  GPUShaderFP64Test7 *this_02;
  
  pTVar2 = (TestNode *)operator_new(0x170);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"errors",
             "Verifies that various erroneous conditions related to double-precision float uniform support & glUniform*() / glUniformMatrix*() API  are reported correctly."
            );
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_02124100;
  *(undefined1 *)&pTVar2[1].m_testCtx = 1;
  memset((void *)((long)&pTVar2[1].m_testCtx + 4),0,0xf4);
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(200);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"max_uniform_components",
             "Verifies that maximum allowed uniform components can be used as double-precision float types"
            );
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__GPUShaderFP64Test2_02124138;
  pTVar2[1].m_testCtx = (TestContext *)0x0;
  pTVar2[1].m_name._M_dataplus._M_p = (pointer)0x0;
  pTVar2[1].m_name._M_string_length = 0;
  pTVar2[1].m_name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pTVar2[1].m_name.field_2 + 8) = 0;
  pTVar2[1].m_description._M_dataplus._M_p = (pointer)0x0;
  pTVar2[1].m_description._M_string_length = 0;
  pTVar2[1].m_description.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pTVar2[1].m_description.field_2 + 4) = 0;
  *(undefined8 *)((long)&pTVar2[1].m_description.field_2 + 0xc) = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x1a8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"named_uniform_blocks",
             "Verifies usage of \"double precision\" floats in \"named uniform block\"");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__GPUShaderFP64Test3_02124170;
  memset(&pTVar2[1].m_description,0,0x108);
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  this_00 = (GPUShaderFP64Test4 *)operator_new(0x14e8);
  GPUShaderFP64Test4::GPUShaderFP64Test4(this_00,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  this_01 = (GPUShaderFP64Test5 *)operator_new(0xf8);
  GPUShaderFP64Test5::GPUShaderFP64Test5(this_01,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_01);
  pTVar2 = (TestNode *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"illegal_conversions",
             "Verifies that invalid casts to double-precision variables are detected during compilation time."
            );
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_02124250;
  pTVar2[1].m_testCtx = (TestContext *)0x0;
  pTVar2[1].m_name._M_dataplus._M_p = (pointer)0x0;
  pTVar2[1].m_name._M_string_length = 0;
  pTVar2[1].m_name.field_2._M_local_buf[0] = '\x01';
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  this_02 = (GPUShaderFP64Test7 *)operator_new(0x170);
  GPUShaderFP64Test7::GPUShaderFP64Test7(this_02,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_02);
  pTVar2 = (TestNode *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"valid_constructors",
             "Verifies that valid double-precision floating-point constructors are accepted during compilation stage"
            );
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_021242c0;
  pTVar2[1].m_testCtx = (TestContext *)0x0;
  pTVar2[1].m_name._M_dataplus._M_p = (pointer)0x0;
  pTVar2[1].m_name._M_string_length = 0;
  pTVar2[1].m_name.field_2._M_local_buf[0] = '\x01';
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x90);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"operators",
             "Verifies that general and relational operators work correctly when used against double-precision floating-point types."
            );
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_021242f8;
  *(undefined1 *)&pTVar2[1].m_testCtx = 1;
  *(undefined8 *)((long)&pTVar2[1].m_testCtx + 4) = 0;
  *(undefined8 *)((long)&pTVar2[1].m_name._M_dataplus._M_p + 4) = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x100);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"built_in_functions",
             "Verify that built-in functions support double-precision types");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__GPUShaderFP64Test10_02124358;
  pTVar2[1].m_testCtx = (TestContext *)0x0;
  pTVar2[1].m_name._M_dataplus._M_p = (pointer)0x0;
  pTVar2[1].m_name._M_string_length = 0;
  pTVar2[1].m_name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pTVar2[1].m_name.field_2 + 8) = 0;
  pTVar2[1].m_description._M_dataplus._M_p = (pointer)0x0;
  pTVar2[1].m_description._M_string_length = 0;
  pTVar2[1].m_description.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pTVar2[1].m_description.field_2 + 8) = 0;
  *(undefined8 *)&pTVar2[1].m_nodeType = 0;
  pTVar2[1].m_children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  pTVar2[1].m_children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  pTVar2[1].m_children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pTVar2[2]._vptr_TestNode = (_func_int **)&pTVar2[2].m_name;
  pTVar2[2].m_testCtx = (TestContext *)0x0;
  *(undefined1 *)&pTVar2[2].m_name._M_dataplus._M_p = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  return extraout_EAX;
}

Assistant:

void GPUShaderFP64Tests::init(void)
{
	addChild(new GPUShaderFP64Test1(m_context));
	addChild(new GPUShaderFP64Test2(m_context));
	addChild(new GPUShaderFP64Test3(m_context));
	addChild(new GPUShaderFP64Test4(m_context));
	addChild(new GPUShaderFP64Test5(m_context));
	addChild(new GPUShaderFP64Test6(m_context));
	addChild(new GPUShaderFP64Test7(m_context));
	addChild(new GPUShaderFP64Test8(m_context));
	addChild(new GPUShaderFP64Test9(m_context));
	addChild(new GPUShaderFP64Test10(m_context));
}